

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265d_vdpu384a.c
# Opt level: O2

void hal_vdpu384a_record_scaling_list
               (scalingFactor_t *pScalingFactor_out,scalingList_t *pScalingList)

{
  ulong uVar1;
  RK_U8 *pRVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  RK_U8 *pRVar6;
  scalingList_t *psVar7;
  RK_U8 *local_78;
  BitputCtx_t bp;
  
  mpp_set_bitput_ctx(&bp,(RK_U64 *)pScalingFactor_out,0xaa);
  pRVar2 = pScalingList->sl[0][0] + 0xc;
  for (lVar5 = 0; lVar4 = -4, lVar5 != 6; lVar5 = lVar5 + 1) {
    for (; lVar4 != 0; lVar4 = lVar4 + 1) {
      mpp_put_bits(&bp,(ulong)pRVar2[lVar4 + -8],8);
      mpp_put_bits(&bp,(ulong)pRVar2[lVar4 + -4],8);
      mpp_put_bits(&bp,(ulong)pRVar2[lVar4],8);
      mpp_put_bits(&bp,(ulong)pRVar2[lVar4 + 4],8);
    }
    pRVar2 = pRVar2 + 0x40;
  }
  local_78 = pScalingList->sl[1][0] + 0x18;
  for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
    pRVar2 = local_78;
    for (uVar1 = 0; uVar1 < 8; uVar1 = uVar1 + 4) {
      pRVar6 = pRVar2;
      for (uVar3 = 0; lVar4 = -4, uVar3 < 8; uVar3 = uVar3 + 4) {
        for (; lVar4 != 0; lVar4 = lVar4 + 1) {
          mpp_put_bits(&bp,(ulong)pRVar6[lVar4 + -0x14],8);
          mpp_put_bits(&bp,(ulong)pRVar6[lVar4 + -0xc],8);
          mpp_put_bits(&bp,(ulong)pRVar6[lVar4 + -4],8);
          mpp_put_bits(&bp,(ulong)pRVar6[lVar4 + 4],8);
        }
        pRVar6 = pRVar6 + 0x20;
      }
      pRVar2 = pRVar2 + 4;
    }
    local_78 = local_78 + 0x40;
  }
  local_78 = pScalingList->sl[2][0] + 0x18;
  for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
    pRVar2 = local_78;
    for (uVar1 = 0; uVar1 < 8; uVar1 = uVar1 + 4) {
      pRVar6 = pRVar2;
      for (uVar3 = 0; lVar4 = -4, uVar3 < 8; uVar3 = uVar3 + 4) {
        for (; lVar4 != 0; lVar4 = lVar4 + 1) {
          mpp_put_bits(&bp,(ulong)pRVar6[lVar4 + -0x14],8);
          mpp_put_bits(&bp,(ulong)pRVar6[lVar4 + -0xc],8);
          mpp_put_bits(&bp,(ulong)pRVar6[lVar4 + -4],8);
          mpp_put_bits(&bp,(ulong)pRVar6[lVar4 + 4],8);
        }
        pRVar6 = pRVar6 + 0x20;
      }
      pRVar2 = pRVar2 + 4;
    }
    local_78 = local_78 + 0x40;
  }
  local_78 = pScalingList->sl[3][0] + 0x18;
  for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
    pRVar2 = local_78;
    for (uVar1 = 0; uVar1 < 8; uVar1 = uVar1 + 4) {
      pRVar6 = pRVar2;
      for (uVar3 = 0; lVar4 = -4, uVar3 < 8; uVar3 = uVar3 + 4) {
        for (; lVar4 != 0; lVar4 = lVar4 + 1) {
          mpp_put_bits(&bp,(ulong)pRVar6[lVar4 + -0x14],8);
          mpp_put_bits(&bp,(ulong)pRVar6[lVar4 + -0xc],8);
          mpp_put_bits(&bp,(ulong)pRVar6[lVar4 + -4],8);
          mpp_put_bits(&bp,(ulong)pRVar6[lVar4 + 4],8);
        }
        pRVar6 = pRVar6 + 0x20;
      }
      pRVar2 = pRVar2 + 4;
    }
    local_78 = local_78 + 0x40;
  }
  psVar7 = pScalingList;
  for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      mpp_put_bits(&bp,(ulong)psVar7->sl[0][0][lVar4],8);
    }
    psVar7 = (scalingList_t *)(psVar7->sl[0] + 1);
  }
  for (lVar5 = -6; lVar5 != 0; lVar5 = lVar5 + 1) {
    mpp_put_bits(&bp,(ulong)pScalingList->sl_dc[1][lVar5],8);
  }
  for (lVar5 = -6; lVar5 != 0; lVar5 = lVar5 + 1) {
    mpp_put_bits(&bp,(ulong)pScalingList[1].sl[0][0][lVar5],8);
  }
  mpp_put_align(&bp,0x80,0);
  return;
}

Assistant:

void hal_vdpu384a_record_scaling_list(scalingFactor_t *pScalingFactor_out, scalingList_t *pScalingList)
{
    RK_S32 i;
    RK_U32 listId;
    BitputCtx_t bp;

    mpp_set_bitput_ctx(&bp, (RK_U64 *)pScalingFactor_out, 170); // 170*64bits

    //-------- following make it by hardware needed --------
    //sizeId == 0, block4x4
    for (listId = 0; listId < SCALING_LIST_NUM; listId++) {
        RK_U8 *p_data = pScalingList->sl[0][listId];
        /* dump by block4x4, vectial direction */
        for (i = 0; i < 4; i++) {
            mpp_put_bits(&bp, p_data[i + 0], 8);
            mpp_put_bits(&bp, p_data[i + 4], 8);
            mpp_put_bits(&bp, p_data[i + 8], 8);
            mpp_put_bits(&bp, p_data[i + 12], 8);
        }
    }
    //sizeId == 1, block8x8
    for (listId = 0; listId < SCALING_LIST_NUM; listId++) {
        RK_S32 blk4_x = 0, blk4_y = 0;
        RK_U8 *p_data = pScalingList->sl[1][listId];

        /* dump by block4x4, vectial direction */
        for (blk4_x = 0; blk4_x < 8; blk4_x += 4) {
            for (blk4_y = 0; blk4_y < 8; blk4_y += 4) {
                RK_S32 pos = blk4_y * 8 + blk4_x;

                for (i = 0; i < 4; i++) {
                    mpp_put_bits(&bp, p_data[pos + i + 0], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 8], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 16], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 24], 8);
                }
            }
        }
    }
    //sizeId == 2, block16x16
    for (listId = 0; listId < SCALING_LIST_NUM; listId++) {
        RK_S32 blk4_x = 0, blk4_y = 0;
        RK_U8 *p_data = pScalingList->sl[2][listId];

        /* dump by block4x4, vectial direction */
        for (blk4_x = 0; blk4_x < 8; blk4_x += 4) {
            for (blk4_y = 0; blk4_y < 8; blk4_y += 4) {
                RK_S32 pos = blk4_y * 8 + blk4_x;

                for (i = 0; i < 4; i++) {
                    mpp_put_bits(&bp, p_data[pos + i + 0], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 8], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 16], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 24], 8);
                }
            }
        }
    }
    //sizeId == 3, blcok32x32
    for (listId = 0; listId < 6; listId++) {
        RK_S32 blk4_x = 0, blk4_y = 0;
        RK_U8 *p_data = pScalingList->sl[3][listId];

        /* dump by block4x4, vectial direction */
        for (blk4_x = 0; blk4_x < 8; blk4_x += 4) {
            for (blk4_y = 0; blk4_y < 8; blk4_y += 4) {
                RK_S32 pos = blk4_y * 8 + blk4_x;

                for (i = 0; i < 4; i++) {
                    mpp_put_bits(&bp, p_data[pos + i + 0], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 8], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 16], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 24], 8);
                }
            }
        }
    }
    //sizeId == 0, block4x4, horiztion direction */
    for (listId = 0; listId < SCALING_LIST_NUM; listId++) {
        RK_U8 *p_data = pScalingList->sl[0][listId];

        for (i = 0; i < 16; i++)
            mpp_put_bits(&bp, p_data[i], 8);
    }

    // dump dc value
    for (i = 0; i < SCALING_LIST_NUM; i++)//sizeId = 2, 16x16
        mpp_put_bits(&bp, pScalingList->sl_dc[0][i], 8);
    for (i = 0; i < SCALING_LIST_NUM; i++) //sizeId = 3, 32x32
        mpp_put_bits(&bp, pScalingList->sl_dc[1][i], 8);

    mpp_put_align(&bp, 128, 0);
}